

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O0

void kv_get_var_test(btree_kv_ops *kv_ops)

{
  int iVar1;
  char acStackY_d8 [16];
  char acStackY_c8 [16];
  char acStackY_b8 [8];
  undefined8 uStackY_b0;
  undefined8 in_stack_ffffffffffffff60;
  undefined4 uVar2;
  char *k2;
  char *k1;
  char *str;
  uint8_t vsize;
  uint8_t ksize;
  uint64_t uStack_80;
  idx_t idx;
  uint64_t v_out;
  uint64_t v_in;
  bnoderef node;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  btree_kv_ops *kv_ops_local;
  
  uVar2 = (undefined4)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  uStackY_b0 = 0x1025ac;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  uStackY_b0 = 0x1025b9;
  memleak_start();
  uStackY_b0 = 0x1025d3;
  v_in = (uint64_t)
         dummy_node((uint8_t)((uint)uVar2 >> 0x18),(uint8_t)((uint)uVar2 >> 0x10),(uint16_t)uVar2);
  memset(acStackY_b8,0,8);
  strcpy(acStackY_b8,"keystr");
  v_out = 0x14;
  (*kv_ops->set_kv)((bnode *)v_in,0,acStackY_b8,&v_out);
  (*kv_ops->get_kv)((bnode *)v_in,0,acStackY_c8,&stack0xffffffffffffff80);
  iVar1 = strcmp(acStackY_c8,acStackY_b8);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x111);
    kv_get_var_test::__test_pass = 0;
    iVar1 = strcmp(acStackY_c8,acStackY_b8);
    if (iVar1 != 0) {
      __assert_fail("!(strcmp(k1, str))",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x111,"void kv_get_var_test(btree_kv_ops *)");
    }
  }
  if (uStack_80 != v_out) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x112);
    kv_get_var_test::__test_pass = 0;
    if (uStack_80 != v_out) {
      __assert_fail("v_out == v_in",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x112,"void kv_get_var_test(btree_kv_ops *)");
    }
  }
  (*kv_ops->get_kv)((bnode *)v_in,0,acStackY_d8,(void *)0x0);
  iVar1 = strcmp(acStackY_d8,acStackY_b8);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x116);
    kv_get_var_test::__test_pass = 0;
    iVar1 = strcmp(acStackY_d8,acStackY_b8);
    if (iVar1 != 0) {
      __assert_fail("!(strcmp(k2, str))",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x116,"void kv_get_var_test(btree_kv_ops *)");
    }
  }
  free((void *)v_in);
  memleak_end();
  if (kv_get_var_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","kv_get_var_test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","kv_get_var_test");
  }
  return;
}

Assistant:

void kv_get_var_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    uint64_t v_in, v_out;
    idx_t idx;
    uint8_t ksize, vsize;

    ksize = 8;
    vsize = sizeof(v_in);
    node = dummy_node(ksize, vsize, 1);

    char *str = alca(char, ksize);
    char *k1 = alca(char, ksize);
    char *k2 = alca(char, ksize);
    memset(str, 0x0, ksize);
    strcpy(str, "keystr");

    idx = 0;
    v_in = 20;

    // set get key
    kv_ops->set_kv(node, idx, str, (void *)&v_in);
    kv_ops->get_kv(node, idx, k1, (void *)&v_out);
    TEST_CHK(!(strcmp(k1, str)));
    TEST_CHK(v_out == v_in);

    // get with value is NULL
    kv_ops->get_kv(node, idx, k2, NULL);
    TEST_CHK(!(strcmp(k2, str)));

    free(node);
    memleak_end();
    TEST_RESULT("kv_get_var_test");
}